

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_skip_list.c
# Opt level: O1

void test_skiplist_randomized_insert(planck_unit_test_t *tc)

{
  sl_node *psVar1;
  sl_node *psVar2;
  planck_unit_result_t pVar3;
  ion_status_t iVar4;
  int iVar5;
  int key;
  ion_byte_t str [10];
  ion_skiplist_t skiplist;
  int local_78;
  undefined4 local_74;
  undefined3 uStack_70;
  ion_skiplist_t local_68;
  
  sl_initialize(&local_68,key_type_numeric_signed,4,10,7,1,4);
  local_68.super.compare = dictionary_compare_signed_value;
  uStack_70 = 0x6d6f;
  local_74 = 0x646e6172;
  iVar5 = 100;
  do {
    local_78 = rand();
    local_78 = local_78 % 0x65;
    iVar4 = sl_insert(&local_68,&local_78,&local_74);
    pVar3 = planck_unit_assert_true
                      (tc,(uint)(iVar4.error == '\0'),0x123,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    if ((pVar3 == '\0') ||
       (pVar3 = planck_unit_assert_true
                          (tc,(uint)(iVar4.count == 1),0x124,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                           ,"condition was false, expected true"), pVar3 == '\0'))
    goto LAB_00101b80;
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  psVar1 = *(local_68.head)->next;
  psVar2 = *psVar1->next;
  while( true ) {
    if (psVar2 == (sl_node *)0x0) {
      sl_destroy(&local_68);
      return;
    }
    pVar3 = planck_unit_assert_true
                      (tc,(uint)(*psVar1->key <= *psVar2->key),0x131,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    if (pVar3 == '\0') break;
    local_68.head = *(local_68.head)->next;
    psVar1 = *(local_68.head)->next;
    psVar2 = *psVar1->next;
  }
LAB_00101b80:
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_skiplist_randomized_insert(
	planck_unit_test_t *tc
) {
	PRINT_HEADER();

	ion_skiplist_t skiplist;

	initialize_skiplist_std_conditions(&skiplist);

	ion_byte_t str[10];

	strcpy((char *) str, "random");

	int i;

	for (i = 0; i < 100; i++) {
		int key				= rand() % 101;

		ion_status_t status = sl_insert(&skiplist, (ion_key_t) &key, str);

		PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
		PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);
	}

#if ION_DEBUG
	print_skiplist(&skip_list);
#endif

	ion_sl_node_t *cursor = skiplist.head;

	while (cursor->next[0]->next[0] != NULL) {
		int now		= *((int *) cursor->next[0]->key);
		int next	= *((int *) cursor->next[0]->next[0]->key);

		PLANCK_UNIT_ASSERT_TRUE(tc, next >= now);

		cursor = cursor->next[0];
	}

	sl_destroy(&skiplist);
}